

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void __thiscall CVmGramProdMem::~CVmGramProdMem(CVmGramProdMem *this)

{
  long lVar1;
  long *in_RDI;
  CVmGramProdMemBlock *nxt;
  
  while (*in_RDI != 0) {
    lVar1 = *(long *)*in_RDI;
    free((void *)*in_RDI);
    *in_RDI = lVar1;
  }
  return;
}

Assistant:

~CVmGramProdMem()
    {
        /* delete each of our blocks */
        while (block_head_ != 0)
        {
            CVmGramProdMemBlock *nxt;
            
            /* remember the next block */
            nxt = block_head_->nxt_;
            
            /* delete this block */
            t3free(block_head_);

            /* move on to the next */
            block_head_ = nxt;
        }
    }